

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SharedVarAtomicOpCase::iterate
          (SharedVarAtomicOpCase *this)

{
  RenderContext *renderCtx;
  Functions *gl;
  int iVar1;
  ContextType type;
  GLSLVersion version;
  GLuint GVar2;
  deUint32 dVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  char *__s;
  size_t sVar5;
  ostream *poVar6;
  TestError *pTVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  BufferMemMap bufMap;
  Buffer outputBuffer;
  ShaderProgram program;
  InterfaceVariableInfo valueInfo;
  ostringstream src;
  undefined1 auStack_4c8 [4];
  int local_4c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  Functions *local_478;
  BufferMemMap local_470;
  int local_454;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  ObjectWrapper local_430;
  string local_418;
  ShaderProgram local_3f8;
  undefined1 local_328 [8];
  pointer local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  pointer local_308;
  deUint32 local_300;
  undefined8 local_2fc;
  uint uStack_2f4;
  int iStack_2f0;
  undefined5 uStack_2ec;
  undefined8 uStack_2e7;
  ios_base local_2b0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_298;
  undefined1 local_278 [208];
  undefined1 local_1a8 [376];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_478 = (Functions *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_430,(Functions *)CONCAT44(extraout_var_00,iVar1),traits);
  local_4c4 = (this->m_localSize).m_data[0];
  iVar1 = (this->m_localSize).m_data[1];
  iVar17 = (this->m_workSize).m_data[1] * (this->m_workSize).m_data[0] *
           (this->m_workSize).m_data[2];
  iVar10 = (this->m_localSize).m_data[2];
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = glu::getGLSLVersionDeclaration(version);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_4c8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 800);
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
  poVar6 = (ostream *)std::ostream::operator<<(local_1a8,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", local_size_y = ",0x11);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", local_size_z = ",0x11);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_localSize).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"layout(binding = 0) buffer Output {\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    uint values[",0x10);
  uVar16 = iVar1 * local_4c4 * iVar10;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar17 * uVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"} sb_out;\n\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"shared uint count;\n\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
             ,0x87);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    uint globalOffs = localSize*globalNdx;\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    count = 0u;\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    barrier();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    uint oldVal = atomicAdd(count, 1u);\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    sb_out.values[globalOffs+oldVal] = oldVal+1u;\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_328,0,0xac);
  local_278._0_8_ = (pointer)0x0;
  local_278[8] = 0;
  local_278._9_7_ = 0;
  local_278[0x10] = 0;
  local_278._17_8_ = 0;
  std::__cxx11::stringbuf::str();
  local_4a0._0_4_ = 5;
  local_4a0._8_8_ = local_490._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4a0 + 8),local_4c0._M_dataplus._M_p,
             local_4c0._M_dataplus._M_p + local_4c0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + (local_4a0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_4a0 + 8));
  glu::ShaderProgram::ShaderProgram(&local_3f8,renderCtx,(ProgramSources *)local_328);
  if ((char *)local_4a0._8_8_ != local_490._M_local_buf + 8) {
    operator_delete((void *)local_4a0._8_8_,local_490._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_298);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_3f8
                 );
  if (local_3f8.m_program.m_info.linkOk != false) {
    local_328 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"Work groups: ",0xd);
    tcu::operator<<((ostream *)&local_320,&this->m_workSize);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
    std::ios_base::~ios_base(local_2b0);
    gl = local_478;
    (*local_478->useProgram)(local_3f8.m_program.m_program);
    GVar2 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e6,"Output");
    dVar3 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92e6,GVar2,0x9303);
    (*gl->bindBuffer)(0x90d2,local_430.m_object);
    (*gl->bufferData)(0x90d2,(long)(int)dVar3,(void *)0x0,0x88e1);
    (*gl->bindBufferBase)(0x90d2,0,local_430.m_object);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Output buffer setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x3c8);
    (*gl->dispatchCompute)
              ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],
               (this->m_workSize).m_data[2]);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glDispatchCompute()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x3cd);
    GVar2 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e6,"Output");
    dVar3 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92e6,GVar2,0x9303);
    GVar2 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e5,"Output.values");
    local_320 = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308 = (pointer)&DAT_ffffffffffffffff;
    local_300 = 0xffffffff;
    local_2fc = 0;
    uStack_2f4 = 0;
    iStack_2f0 = 0;
    uStack_2ec = 0;
    uStack_2e7 = 0;
    local_328 = (undefined1  [8])&local_318;
    glu::getProgramInterfaceVariableInfo
              (gl,local_3f8.m_program.m_program,0x92e5,GVar2,(InterfaceVariableInfo *)local_328);
    BufferMemMap::BufferMemMap(&local_470,gl,0x90d2,0,dVar3,1);
    if (0 < iVar17) {
      iVar1 = 0;
      uVar11 = 0;
      if (0 < (int)uVar16) {
        uVar11 = (ulong)uVar16;
      }
      iVar10 = 1;
      iVar12 = 0;
      do {
        uVar15 = 0;
        iVar13 = iVar1;
        while (uVar11 != uVar15) {
          lVar14 = (long)iVar13;
          uVar15 = uVar15 + 1;
          iVar13 = iVar13 + iStack_2f0;
          if ((int)uVar15 != *(int *)((long)local_470.m_ptr + lVar14 + (ulong)uStack_2f4)) {
            pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
            local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_450,"Comparison failed for Output.values[","");
            local_454 = (int)uVar15 - iVar10;
            de::toString<int>(&local_418,&local_454);
            std::operator+(&local_4c0,&local_450,&local_418);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_4c0);
            local_4a0._0_8_ = *plVar8;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._0_8_ == paVar9) {
              local_490._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_490._8_8_ = plVar8[3];
              local_4a0._0_8_ = &local_490;
            }
            else {
              local_490._M_allocated_capacity = paVar9->_M_allocated_capacity;
            }
            local_4a0._8_8_ = plVar8[1];
            *plVar8 = (long)paVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            tcu::TestError::TestError(pTVar7,(string *)local_4a0);
            __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        iVar12 = iVar12 + 1;
        iVar10 = iVar10 - uVar16;
        iVar1 = iVar1 + uVar16 * iStack_2f0;
      } while (iVar12 != iVar17);
    }
    (*(local_470.m_gl)->unmapBuffer)(local_470.m_target);
    if (local_328 != (undefined1  [8])&local_318) {
      operator_delete((void *)local_328,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    glu::ShaderProgram::~ShaderProgram(&local_3f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    glu::ObjectWrapper::~ObjectWrapper(&local_430);
    return STOP;
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x3ba);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "shared uint count;\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "\n"
			<< "    count = 0u;\n"
			<< "    barrier();\n"
			<< "    uint oldVal = atomicAdd(count, 1u);\n"
			<< "    sb_out.values[globalOffs+oldVal] = oldVal+1u;\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			for (int groupNdx = 0; groupNdx < workGroupCount; groupNdx++)
			{
				for (int localOffs = 0; localOffs < workGroupSize; localOffs++)
				{
					const int		globalOffs	= groupNdx*workGroupSize;
					const deUint32	res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*(globalOffs + localOffs)));
					const deUint32	ref			= (deUint32)(localOffs+1);

					if (res != ref)
						throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(globalOffs + localOffs) + "]");
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}